

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ion_file.c
# Opt level: O1

ion_err_t ion_fread(ion_file_handle_t file,uint num_bytes,ion_byte_t *write_to)

{
  size_t sVar1;
  
  sVar1 = fread(write_to,(ulong)num_bytes,1,(FILE *)file);
  return (sVar1 != 1) << 3;
}

Assistant:

ion_err_t
ion_fread(
	ion_file_handle_t	file,
	unsigned int		num_bytes,
	ion_byte_t			*write_to
) {
#if defined(ARDUINO)

	if (num_bytes != (fread(write_to, num_bytes, 1, file.file) * num_bytes)) {
		return err_file_read_error;
	}

	return err_ok;
#else

	if (1 != fread(write_to, num_bytes, 1, file)) {
		return err_file_read_error;
	}

	return err_ok;
#endif
}